

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O1

bool __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
          (CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this,uint k,int *lastOcc)

{
  Type pNVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  byte bVar6;
  Type pNVar7;
  uint uVar8;
  
  if (k < 0x100) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0x117,"(k >= directSize)","k >= directSize");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pNVar7 = this->root;
  if (pNVar7 == (Type)0x0) {
    bVar4 = false;
  }
  else {
    pNVar1 = *(Type *)((long)&pNVar7[1]._vptr_Node + (ulong)(k >> 9 & 0x78));
    if (pNVar1 == (Type)0x0) {
      bVar4 = false;
    }
    else {
      bVar6 = 8;
      uVar8 = 4;
      do {
        pNVar7 = pNVar1;
        uVar8 = uVar8 - 1;
        bVar4 = uVar8 < 2;
        if (bVar4) break;
        bVar2 = bVar6 & 0x1f;
        bVar6 = bVar6 - 4;
        pNVar1 = (Type)pNVar7[(ulong)(k >> bVar2 & 0xf) + 1]._vptr_Node;
      } while ((Type)pNVar7[(ulong)(k >> bVar2 & 0xf) + 1]._vptr_Node != (Type)0x0);
    }
    if (bVar4 != false) {
      *lastOcc = *(int *)((long)&pNVar7[1]._vptr_Node + (ulong)(k & 0xf) * 4);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool GetNonDirect(uint k, V& lastOcc) const
        {
            Assert(k >= directSize);
            if (root == nullptr)
            {
                return false;
            }
            Node* curr = root;
            for (int level = levels - 1; level > 0; level--)
            {
                Inner* inner = (Inner*)curr;
                uint i = innerIdx(level, k);
                if (inner->children[i] == 0)
                    return false;
                else
                    curr = inner->children[i];
            }
            Leaf* leaf = (Leaf*)curr;
            lastOcc = leaf->values[leafIdx(k)];
            return true;
        }